

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.hpp
# Opt level: O1

void __thiscall
boost::deflate::detail::deflate_stream::send_bits(deflate_stream *this,int value,int length)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  
  iVar3 = this->bi_valid_;
  if (0x10 - length < iVar3) {
    uVar2 = (ushort)(value << ((byte)iVar3 & 0x1f)) | this->bi_buf_;
    this->bi_buf_ = uVar2;
    uVar1 = this->pending_;
    this->pending_ = uVar1 + 1;
    this->pending_buf_[uVar1] = (Byte)uVar2;
    uVar1 = this->pending_;
    this->pending_ = uVar1 + 1;
    this->pending_buf_[uVar1] = (Byte)(uVar2 >> 8);
    this->bi_buf_ = (uint16_t)((value & 0xffffU) >> (0x10U - (char)this->bi_valid_ & 0x1f));
    iVar3 = length + this->bi_valid_ + -0x10;
  }
  else {
    this->bi_buf_ = this->bi_buf_ | (ushort)(value << ((byte)iVar3 & 0x1f));
    iVar3 = length + iVar3;
  }
  this->bi_valid_ = iVar3;
  return;
}

Assistant:

void
    send_bits(int value, int length)
    {
        if(bi_valid_ > (int)buf_size - length)
        {
            bi_buf_ |= (std::uint16_t)value << bi_valid_;
            put_short(bi_buf_);
            bi_buf_ = (std::uint16_t)value >> (buf_size - bi_valid_);
            bi_valid_ += length - buf_size;
        }
        else
        {
            bi_buf_ |= (std::uint16_t)(value) << bi_valid_;
            bi_valid_ += length;
        }
    }